

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DancingNode.cpp
# Opt level: O0

DancingNode *
createToridolMatrix(vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                    *Matrix,int nRow,int nCol,
                   vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                   *ProbMat,DancingNode *header)

{
  int iVar1;
  int iVar2;
  s_DancingNode *psVar3;
  s_DancingNode *psVar4;
  bool bVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  bool local_c9;
  bool local_b9;
  bool local_a9;
  bool local_99;
  reference local_88;
  reference local_78;
  reference local_68;
  reference local_58;
  int local_48;
  int local_44;
  int b;
  int a;
  int local_30;
  int local_2c;
  int j;
  int i;
  DancingNode *header_local;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *ProbMat_local;
  int nCol_local;
  int nRow_local;
  vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
  *Matrix_local;
  
  _j = header;
  header_local = (DancingNode *)ProbMat;
  ProbMat_local._0_4_ = nCol;
  ProbMat_local._4_4_ = nRow;
  _nCol_local = Matrix;
  for (local_2c = 0; local_2c <= ProbMat_local._4_4_; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < (int)ProbMat_local; local_30 = local_30 + 1) {
      pvVar6 = std::
               vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                             *)header_local,(long)local_2c);
      _b = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar6,(long)local_30);
      bVar5 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&b);
      if (bVar5) {
        if (local_2c != 0) {
          pvVar7 = std::
                   vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                   ::operator[](_nCol_local,0);
          pvVar8 = std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>::operator[]
                             (pvVar7,(long)local_30);
          pvVar8->nodeCount = pvVar8->nodeCount + 1;
        }
        pvVar7 = std::
                 vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                 ::operator[](_nCol_local,0);
        pvVar8 = std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>::operator[]
                           (pvVar7,(long)local_30);
        pvVar7 = std::
                 vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                 ::operator[](_nCol_local,(long)local_2c);
        pvVar9 = std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>::operator[]
                           (pvVar7,(long)local_30);
        iVar2 = local_2c;
        pvVar9->column = pvVar8;
        pvVar7 = std::
                 vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                 ::operator[](_nCol_local,(long)local_2c);
        pvVar8 = std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>::operator[]
                           (pvVar7,(long)local_30);
        iVar1 = local_30;
        pvVar8->row = iVar2;
        pvVar7 = std::
                 vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                 ::operator[](_nCol_local,(long)local_2c);
        pvVar8 = std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>::operator[]
                           (pvVar7,(long)local_30);
        pvVar8->col = iVar1;
        local_44 = local_2c;
        local_48 = local_30;
        do {
          local_48 = getLeft(local_48,(int)ProbMat_local);
          pvVar6 = std::
                   vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                   ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                 *)header_local,(long)local_44);
          local_58 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar6,(long)local_48);
          bVar5 = std::_Bit_reference::operator_cast_to_bool(&local_58);
          local_99 = !bVar5 && local_48 != local_30;
        } while (local_99);
        pvVar7 = std::
                 vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                 ::operator[](_nCol_local,(long)local_2c);
        pvVar8 = std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>::operator[]
                           (pvVar7,(long)local_48);
        pvVar7 = std::
                 vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                 ::operator[](_nCol_local,(long)local_2c);
        pvVar9 = std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>::operator[]
                           (pvVar7,(long)local_30);
        pvVar9->left = pvVar8;
        local_44 = local_2c;
        local_48 = local_30;
        do {
          local_48 = getRight(local_48,(int)ProbMat_local);
          pvVar6 = std::
                   vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                   ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                 *)header_local,(long)local_44);
          local_68 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar6,(long)local_48);
          bVar5 = std::_Bit_reference::operator_cast_to_bool(&local_68);
          local_a9 = !bVar5 && local_48 != local_30;
        } while (local_a9);
        pvVar7 = std::
                 vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                 ::operator[](_nCol_local,(long)local_2c);
        pvVar8 = std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>::operator[]
                           (pvVar7,(long)local_48);
        pvVar7 = std::
                 vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                 ::operator[](_nCol_local,(long)local_2c);
        pvVar9 = std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>::operator[]
                           (pvVar7,(long)local_30);
        pvVar9->right = pvVar8;
        local_44 = local_2c;
        local_48 = local_30;
        do {
          local_44 = getUp(local_44,ProbMat_local._4_4_);
          pvVar6 = std::
                   vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                   ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                 *)header_local,(long)local_44);
          local_78 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar6,(long)local_48);
          bVar5 = std::_Bit_reference::operator_cast_to_bool(&local_78);
          local_b9 = !bVar5 && local_44 != local_2c;
        } while (local_b9);
        pvVar7 = std::
                 vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                 ::operator[](_nCol_local,(long)local_44);
        pvVar8 = std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>::operator[]
                           (pvVar7,(long)local_30);
        pvVar7 = std::
                 vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                 ::operator[](_nCol_local,(long)local_2c);
        pvVar9 = std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>::operator[]
                           (pvVar7,(long)local_30);
        pvVar9->up = pvVar8;
        local_44 = local_2c;
        local_48 = local_30;
        do {
          local_44 = getDown(local_44,ProbMat_local._4_4_);
          pvVar6 = std::
                   vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                   ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                 *)header_local,(long)local_44);
          local_88 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar6,(long)local_48);
          bVar5 = std::_Bit_reference::operator_cast_to_bool(&local_88);
          local_c9 = !bVar5 && local_44 != local_2c;
        } while (local_c9);
        pvVar7 = std::
                 vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                 ::operator[](_nCol_local,(long)local_44);
        pvVar8 = std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>::operator[]
                           (pvVar7,(long)local_30);
        pvVar7 = std::
                 vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                 ::operator[](_nCol_local,(long)local_2c);
        pvVar9 = std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>::operator[]
                           (pvVar7,(long)local_30);
        pvVar9->down = pvVar8;
      }
    }
  }
  pvVar7 = std::
           vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
           ::operator[](_nCol_local,0);
  pvVar8 = std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>::operator[](pvVar7,0);
  _j->right = pvVar8;
  pvVar7 = std::
           vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
           ::operator[](_nCol_local,0);
  pvVar8 = std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>::operator[]
                     (pvVar7,(long)((int)ProbMat_local + -1));
  psVar3 = _j;
  _j->left = pvVar8;
  pvVar7 = std::
           vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
           ::operator[](_nCol_local,0);
  pvVar8 = std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>::operator[](pvVar7,0);
  psVar4 = _j;
  pvVar8->left = psVar3;
  pvVar7 = std::
           vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
           ::operator[](_nCol_local,0);
  pvVar8 = std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>::operator[]
                     (pvVar7,(long)((int)ProbMat_local + -1));
  pvVar8->right = psVar4;
  return _j;
}

Assistant:

DancingNode *createToridolMatrix(vector<vector<DancingNode>> &Matrix, int nRow, int nCol, vector<vector<bool>> &ProbMat, DancingNode *header) 
{ 
    // One extra row for list header nodes 
    // for each column 
    for(int i = 0; i <= nRow; i++) 
    { 
        for(int j = 0; j < nCol; j++) 
        { 
            // If it's 1 in the problem matrix then  
            // only create a node  
            if(ProbMat[i][j]) 
            {   
                int a, b; 
                //Matrix[i].push_back(DancingNode()); 
                // If it's 1, other than 1 in 0th row 
                // then count it as node of column  
                // and increment node count in column header 
                if(i) Matrix[0][j].nodeCount += 1; 
  
                // Add pointer to column header for this  
                // column node 
                Matrix[i][j].column = &Matrix[0][j]; 
  
                // set row and column id of this node 
                Matrix[i][j].row = i; 
                Matrix[i][j].col = j; 
  
                // Link the node with neighbors 
                // Left pointer 
                a = i; b = j; 
                do{ b = getLeft(b, nCol); } while(!ProbMat[a][b] && b != j); 
                Matrix[i][j].left = &Matrix[i][b]; 
                
                // Right pointer 
                a = i; b = j; 
                do { b = getRight(b, nCol); } while(!ProbMat[a][b] && b != j); 
                Matrix[i][j].right = &Matrix[i][b]; 
                
                // Up pointer 
                a = i; b = j; 
                do { a = getUp(a, nRow); } while(!ProbMat[a][b] && a != i); 
                Matrix[i][j].up = &Matrix[a][j]; 
  
                // Down pointer 
                a = i; b = j; 
                do { a = getDown(a, nRow); } while(!ProbMat[a][b] && a != i); 
                Matrix[i][j].down = &Matrix[a][j]; 
                
            } 
        } 
    } 
  
    // link header right pointer to column  
    // header of first column  
    header->right = &Matrix[0][0]; 
  
    // link header left pointer to column  
    // header of last column  
    header->left = &Matrix[0][nCol-1]; 
  
    Matrix[0][0].left = header; 
    Matrix[0][nCol-1].right = header; 
    return header; 
}